

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

void __thiscall SQArray::Extend(SQArray *this,SQArray *a)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(a->_values)._size;
  if (uVar2 != 0) {
    for (lVar1 = 0; uVar2 << 4 != lVar1; lVar1 = lVar1 + 0x10) {
      Append(this,(SQObject *)((long)&(((a->_values)._vals)->super_SQObject)._type + lVar1));
    }
  }
  return;
}

Assistant:

bool SQDelegable::SetDelegate(SQTable *mt)
{
    SQTable *temp = mt;
    if(temp == this) return false;
    while (temp) {
        if (temp->_delegate == this) return false; //cycle detected
        temp = temp->_delegate;
    }
    if (mt) __ObjAddRef(mt);
    __ObjRelease(_delegate);
    _delegate = mt;
    return true;
}